

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImgProcessor.cpp
# Opt level: O0

vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
* __thiscall
pobr::imgProcessing::ImgProcessor::process
          (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
           *__return_storage_ptr__,ImgProcessor *this)

{
  bool local_1fb [3];
  undefined1 local_1f8 [8];
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  candidates;
  undefined1 local_1d8 [8];
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  segments;
  ImgProcessor local_1b8;
  undefined1 local_151;
  ImgProcessor local_150;
  undefined1 local_d9;
  ImgProcessor local_d8;
  Mat local_78 [8];
  Mat img;
  ImgProcessor *this_local;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  *letterSegments;
  
  assertIsReady(this);
  cv::Mat::Mat(local_78,&this->img);
  local_d9 = 1;
  processPreEnhance(&local_d8,&this->img,(bool *)local_78);
  cv::Mat::operator=(local_78,&local_d8.img);
  cv::Mat::~Mat(&local_d8.img);
  local_151 = 1;
  processBinarize(&local_150,&this->img,(bool *)local_78);
  cv::Mat::operator=(local_78,&local_150.img);
  cv::Mat::~Mat(&local_150.img);
  segments.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  processBinaryEnhance(&local_1b8,&this->img,(bool *)local_78);
  cv::Mat::operator=(local_78,&local_1b8.img);
  cv::Mat::~Mat(&local_1b8.img);
  candidates.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  processSegmentation((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                       *)local_1d8,this,local_78,
                      (bool *)((long)&candidates.
                                      super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1fb[2] = true;
  processFilterCandidates
            ((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
              *)local_1f8,this,
             (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
              *)local_1d8,local_1fb + 2);
  local_1fb[1] = false;
  local_1fb[0] = true;
  processDetection(__return_storage_ptr__,this,
                   (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                    *)local_1f8,local_1fb);
  local_1fb[1] = true;
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             *)local_1f8);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             *)local_1d8);
  cv::Mat::~Mat(local_78);
  return __return_storage_ptr__;
}

Assistant:

const std::vector<structs::Segment>
ImgProcessor::process()
const
{
    this->assertIsReady();

    auto img = this->img;

    img = this->processPreEnhance(img, true);
    img = this->processBinarize(img, true);
    img = this->processBinaryEnhance(img, true);

    auto segments = this->processSegmentation(img, true);
    auto candidates = this->processFilterCandidates(segments, true);
    auto letterSegments = this->processDetection(candidates, true);

    return letterSegments;
}